

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

StringRef llvm::sys::path::root_path(StringRef path,Style style)

{
  StringRef *this;
  char cVar1;
  char cVar2;
  ulong uVar3;
  ulong uVar4;
  path *this_00;
  Style in_R8D;
  path *ppVar5;
  bool bVar6;
  bool bVar7;
  StringRef SVar8;
  StringRef path_00;
  const_iterator b;
  const_iterator pos;
  
  uVar4 = path.Length;
  this_00 = (path *)path.Data;
  path_00.Length._0_4_ = style;
  path_00.Data = (char *)uVar4;
  path_00.Length._4_4_ = 0;
  begin(&b,this_00,path_00,in_R8D);
  pos.Position = b.Position;
  pos.S = b.S;
  pos._44_4_ = b._44_4_;
  pos.Component.Data = b.Component.Data;
  pos.Component.Length = b.Component.Length;
  pos.Path.Data = b.Path.Data;
  pos.Path.Length = b.Path.Length;
  if ((path *)b.Path.Data == this_00) {
    uVar3 = 0;
    ppVar5 = (path *)0x0;
    if (b.Position == uVar4) goto LAB_00141351;
  }
  this = &b.Component;
  if ((b.Component.Length < 3) ||
     ((cVar1 = StringRef::operator[](this,0), cVar1 != '/' && (cVar1 != '\\' || style != windows))))
  {
    bVar6 = false;
  }
  else {
    cVar1 = StringRef::operator[](this,1);
    cVar2 = StringRef::operator[](this,0);
    bVar6 = cVar1 == cVar2;
  }
  if ((style == windows) && (b.Component.Length != 0)) {
    bVar7 = b.Component.Data[b.Component.Length - 1] == ':';
  }
  else {
    bVar7 = false;
  }
  if ((bool)(bVar6 | bVar7)) {
    const_iterator::operator++(&pos);
    if (((path *)pos.Path.Data != this_00) || (pos.Position != uVar4)) {
      cVar1 = StringRef::operator[](&pos.Component,0);
      if ((cVar1 == '/') || (style == windows && cVar1 == '\\')) {
        uVar3 = pos.Component.Length + b.Component.Length;
        ppVar5 = this_00;
        if (uVar4 <= pos.Component.Length + b.Component.Length) {
          uVar3 = uVar4;
        }
        goto LAB_00141351;
      }
    }
  }
  else {
    cVar1 = StringRef::operator[](this,0);
    if ((cVar1 != '/') && (uVar3 = 0, ppVar5 = (path *)0x0, style != windows || cVar1 != '\\'))
    goto LAB_00141351;
  }
  uVar3 = b.Component.Length;
  ppVar5 = (path *)b.Component.Data;
LAB_00141351:
  SVar8.Length = uVar3;
  SVar8.Data = (char *)ppVar5;
  return SVar8;
}

Assistant:

StringRef root_path(StringRef path, Style style) {
  const_iterator b = begin(path, style), pos = b, e = end(path);
  if (b != e) {
    bool has_net =
        b->size() > 2 && is_separator((*b)[0], style) && (*b)[1] == (*b)[0];
    bool has_drive = (real_style(style) == Style::windows) && b->endswith(":");

    if (has_net || has_drive) {
      if ((++pos != e) && is_separator((*pos)[0], style)) {
        // {C:/,//net/}, so get the first two components.
        return path.substr(0, b->size() + pos->size());
      } else {
        // just {C:,//net}, return the first component.
        return *b;
      }
    }

    // POSIX style root directory.
    if (is_separator((*b)[0], style)) {
      return *b;
    }
  }

  return StringRef();
}